

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_callk(lua_State *L,int nargs,int nresults,int ctx,lua_CFunction k)

{
  StkId pTVar1;
  StkId func;
  lua_CFunction k_local;
  int ctx_local;
  int nresults_local;
  int nargs_local;
  lua_State *L_local;
  
  pTVar1 = L->top;
  if ((k == (lua_CFunction)0x0) || (L->nny != 0)) {
    luaD_call(L,pTVar1 + -(long)(nargs + 1),nresults,0);
  }
  else {
    (L->ci->u).c.k = k;
    (L->ci->u).c.ctx = ctx;
    luaD_call(L,pTVar1 + -(long)(nargs + 1),nresults,1);
  }
  if ((nresults == -1) && (L->ci->top < L->top)) {
    L->ci->top = L->top;
  }
  return;
}

Assistant:

LUA_API void lua_callk (lua_State *L, int nargs, int nresults, int ctx,
                        lua_CFunction k) {
  StkId func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  func = L->top - (nargs+1);
  if (k != NULL && L->nny == 0) {  /* need to prepare continuation? */
    L->ci->u.c.k = k;  /* save continuation */
    L->ci->u.c.ctx = ctx;  /* save context */
    luaD_call(L, func, nresults, 1);  /* do the call */
  }
  else  /* no continuation or no yieldable */
    luaD_call(L, func, nresults, 0);  /* just do the call */
  adjustresults(L, nresults);
  lua_unlock(L);
}